

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

ebml_element * EBML_FindNextId(stream *Input,ebml_context *Context,size_t MaxDataSize)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  filepos_t fVar6;
  ebml_element *p;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  int in_R9D;
  int iVar10;
  byte bVar11;
  char IdLength;
  uint uVar12;
  ulong uVar13;
  uint8_t PossibleId [4];
  ulong local_78;
  filepos_t SizeUnknown;
  long local_68;
  size_t local_60;
  ebml_context *local_58;
  filepos_t local_50;
  ulong local_48;
  filepos_t local_40;
  uint8_t PossibleSize [8];
  
  SizeUnknown = 8;
  uVar7 = 0;
  fVar6 = 0;
  bVar3 = false;
  IdLength = '\0';
  bVar11 = 0;
  local_60 = MaxDataSize;
  local_58 = Context;
  do {
    if (bVar3) {
      p = CreateElement(Input,PossibleId,IdLength,local_58,(ebml_master *)0xffffffffffffffff,in_R9D)
      ;
      if (p == (ebml_element *)0x0) {
        __assert_fail("Result != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x162,
                      "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)"
                     );
      }
      p->SizeLength = bVar11;
      p->DataSize = fVar6;
      lVar5 = (**(code **)((long)(p->Base).Base.VMT + 0x70))(p);
      if ((lVar5 == 0) || ((fVar6 != SizeUnknown && (local_60 < (ulong)p->DataSize)))) {
        NodeDelete((node *)p);
LAB_001104e4:
        p = (ebml_element *)0x0;
      }
      else {
        p->ElementPosition = local_50;
        p->SizePosition = local_68;
        p->EndPosition = fVar6 + local_68 + uVar7;
      }
      return p;
    }
    local_48 = uVar7;
    local_40 = fVar6;
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0x13d,
                    "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
    }
    local_50 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    iVar10 = 1;
    uVar12 = 0x80;
    do {
      cVar2 = (char)iVar10;
      cVar8 = IdLength + cVar2 + -1;
      lVar5 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,PossibleId + cVar8,1,0);
      if (lVar5 != 0) {
        bVar3 = false;
        goto LAB_00110400;
      }
      if ((iVar10 == cVar8) || ('\x04' < (char)(IdLength + cVar2))) goto LAB_001104e4;
      iVar10 = iVar10 + 1;
      uVar1 = uVar12 & PossibleId[0];
      uVar12 = uVar12 >> 1;
    } while (uVar1 == 0);
    cVar2 = (char)iVar10;
    bVar3 = true;
LAB_00110400:
    IdLength = IdLength + cVar2 + -1;
    local_68 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    uVar9 = local_48;
    fVar6 = local_40;
    uVar4 = (ulong)bVar11;
    do {
      uVar13 = uVar4;
      if (7 < uVar13) goto LAB_001104e4;
      lVar5 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,PossibleSize + uVar13,1,0);
      uVar7 = uVar9;
      if (lVar5 != 0) break;
      local_78 = uVar13 + 1;
      fVar6 = EBML_ReadCodedSizeValue(PossibleSize,&local_78,&SizeUnknown);
      uVar9 = 0;
      uVar7 = local_78;
      uVar4 = uVar13 + 1;
    } while (local_78 == 0);
    bVar11 = (char)uVar13 + 1;
  } while( true );
}

Assistant:

ebml_element *EBML_FindNextId(struct stream *Input, const ebml_context *Context, size_t MaxDataSize)
{
    filepos_t aElementPosition, aSizePosition;
    filepos_t SizeFound=0, SizeUnknown=8;
    int ReadSize;
    uint8_t BitMask;
    uint8_t PossibleId[4];
    uint8_t PossibleSize[8]; // we don't support size stored in more than 64 bits
    bool_t bElementFound = 0;
    int8_t PossibleID_Length = 0;
    size_t _SizeLength=0;
    uint8_t PossibleSizeLength = 0;
    ebml_element *Result = NULL;

    while (!bElementFound)
    {
        aElementPosition = Stream_Seek(Input,0,SEEK_CUR);
        ReadSize = 0;
        BitMask = 1 << 7;
        for (;;)
        {
            if (Stream_ReadOneOrMore(Input,&PossibleId[PossibleID_Length], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            if (ReadSize == PossibleID_Length)
                return NULL; // No more data ?
            if (++PossibleID_Length > 4)
                return NULL; // we don't support element IDs over class D
            if (PossibleId[0] & BitMask)
            {
                bElementFound = 1;
                break;
            }
            BitMask >>= 1;
        }

        // read the data size
        aSizePosition = Stream_Seek(Input,0,SEEK_CUR);
        do {
            if (PossibleSizeLength >= 8)
                // Size is larger than 8 bytes
                return NULL;

            if (Stream_ReadOneOrMore(Input,&PossibleSize[PossibleSizeLength++], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleSize[0], &_SizeLength, &SizeUnknown);
        } while (_SizeLength == 0);
    }

    // look for the ID in the provided context
    Result = CreateElement(Input, PossibleId, PossibleID_Length, Context,NULL, EBML_ANY_PROFILE);
    assert(Result != NULL);
#if 0
if (PossibleID_Length==4)
printf("Elt: size %d id %d %02X%02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
else if (PossibleID_Length==3)
printf("Elt: size %d id %d %02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2]);
else if (PossibleID_Length==2)
printf("Elt: size %d id %d %02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1]);
else if (PossibleID_Length==1)
printf("Elt: size %d id %d %02X\n",SizeFound,PossibleID_Length,PossibleId[0]);
#endif
    Result->SizeLength = PossibleSizeLength;
    Result->DataSize = SizeFound;
    if (!EBML_ElementValidateSize(Result) || (SizeFound != SizeUnknown && MaxDataSize < (size_t)Result->DataSize))
    {
        NodeDelete((node*)Result);
        return NULL;
    }
    Result->ElementPosition = aElementPosition;
    Result->SizePosition = aSizePosition;
    Result->EndPosition = aSizePosition + _SizeLength + SizeFound;

    return Result;
}